

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_slot_allocator_init
                    (ma_slot_allocator_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks
                    ,ma_slot_allocator *pAllocator)

{
  ma_result mVar1;
  void *pHeap;
  ma_slot_allocator_heap_layout layout;
  ma_slot_allocator_heap_layout local_40;
  
  mVar1 = ma_slot_allocator_get_heap_layout(pConfig,&local_40);
  if (mVar1 != MA_SUCCESS) {
    return mVar1;
  }
  if (local_40.sizeInBytes == 0) {
    pHeap = (void *)0x0;
LAB_00190345:
    mVar1 = ma_slot_allocator_init_preallocated(pConfig,pHeap,pAllocator);
    if (mVar1 == MA_SUCCESS) {
      pAllocator->_ownsHeap = 1;
      mVar1 = MA_SUCCESS;
    }
    else {
      ma_free(pHeap,pAllocationCallbacks);
    }
  }
  else {
    if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      pHeap = malloc(local_40.sizeInBytes);
LAB_0019033d:
      if (pHeap != (void *)0x0) goto LAB_00190345;
    }
    else if (pAllocationCallbacks->onMalloc != (_func_void_ptr_size_t_void_ptr *)0x0) {
      pHeap = (*pAllocationCallbacks->onMalloc)
                        (local_40.sizeInBytes,pAllocationCallbacks->pUserData);
      goto LAB_0019033d;
    }
    mVar1 = MA_OUT_OF_MEMORY;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_slot_allocator_init(const ma_slot_allocator_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_slot_allocator* pAllocator)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_slot_allocator_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;  /* Failed to retrieve the size of the heap allocation. */
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_slot_allocator_init_preallocated(pConfig, pHeap, pAllocator);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pAllocator->_ownsHeap = MA_TRUE;
    return MA_SUCCESS;
}